

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashers.hpp
# Opt level: O0

bool __thiscall xercesc_4_0::StringHasher::equals(StringHasher *this,void *key1,void *key2)

{
  bool bVar1;
  void *key2_local;
  void *key1_local;
  StringHasher *this_local;
  
  bVar1 = XMLString::equals((XMLCh *)key1,(XMLCh *)key2);
  return bVar1;
}

Assistant:

bool equals(const void *const key1, const void *const key2) const
  {
    return XMLString::equals ((const XMLCh*)key1, (const XMLCh*)key2);
  }